

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<int,void>::insert<int_const&>(HighsHashTable<int,void> *this,int *args)

{
  u8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  u8 meta;
  Entry entry;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_25;
  HighsHashTableEntry<int,_void> local_24;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_24.value_ = *args;
  bVar5 = HighsHashTable<int,_void>::findPosition
                    ((HighsHashTable<int,_void> *)this,&local_24.value_,&local_25,&local_10,
                     &local_18,&local_20);
  if (bVar5) {
    bVar5 = false;
  }
  else {
    uVar6 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) != uVar6 * 7 + 7 >> 3) && (local_20 != local_18)) {
      lVar3 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar7 = local_18;
      do {
        lVar4 = *(long *)(this + 8);
        if (-1 < (char)*(byte *)(lVar4 + local_20)) {
          *(u8 *)(lVar4 + local_20) = local_25;
          *(int *)(lVar3 + local_20 * 4) = local_24.value_;
          return true;
        }
        uVar8 = (ulong)((int)local_20 - (uint)*(byte *)(lVar4 + local_20) & 0x7f);
        if (uVar8 < (local_20 - local_10 & uVar6)) {
          iVar2 = *(int *)(lVar3 + local_20 * 4);
          *(int *)(lVar3 + local_20 * 4) = local_24.value_;
          uVar1 = *(u8 *)(lVar4 + local_20);
          *(u8 *)(lVar4 + local_20) = local_25;
          uVar6 = *(ulong *)(this + 0x10);
          local_10 = local_20 - uVar8 & uVar6;
          uVar7 = local_10 + 0x7f & uVar6;
          local_25 = uVar1;
          local_24.value_ = iVar2;
          local_18 = uVar7;
        }
        local_20 = local_20 + 1 & uVar6;
      } while (local_20 != uVar7);
      HighsHashTable<int,_void>::growTable((HighsHashTable<int,_void> *)this);
      insert<HighsHashTableEntry<int,void>>(this,&local_24);
      return true;
    }
    HighsHashTable<int,_void>::growTable((HighsHashTable<int,_void> *)this);
    bVar5 = insert<HighsHashTableEntry<int,void>>(this,&local_24);
  }
  return bVar5;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }